

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,DotOperator *d)

{
  Allocator *this_00;
  UnqualifiedName *pUVar1;
  undefined8 this_01;
  bool bVar2;
  uint uVar3;
  ProcessorInstanceRef *pPVar4;
  ProcessorBase *pPVar5;
  size_t sVar6;
  pool_ref<soul::AST::ASTObject> *ppVar7;
  Expression *pEVar8;
  UnqualifiedName *in_RCX;
  Context *args;
  bool local_4b9;
  CompileMessage local_400;
  CompileMessage local_3c8;
  CompileMessage local_390;
  byte local_351;
  string local_350;
  undefined1 local_330 [8];
  pool_ptr<soul::AST::Expression> metaFunction_1;
  string local_308;
  CompileMessage local_2e8;
  undefined1 local_2b0 [8];
  string name_1;
  string local_270;
  CompileMessage local_250;
  string_view local_218;
  undefined1 local_208 [8];
  string name;
  Structure *s;
  Type lhsType;
  pool_ptr<soul::AST::Expression> metaFunction;
  pool_ref<soul::AST::Expression> local_188;
  pool_ptr<soul::AST::DotOperator> local_180;
  pool_ptr<soul::AST::DotOperator> nestedDots;
  pool_ref<soul::AST::ASTObject> local_170;
  IdentifierPath local_168;
  undefined1 local_110 [8];
  NameSearch search;
  pool_ptr<soul::AST::ProcessorBase> processor;
  pool_ref<soul::AST::Expression> local_38;
  pool_ptr<soul::AST::ProcessorInstanceRef> local_30;
  pool_ptr<soul::AST::ProcessorInstanceRef> processorInstance;
  Expression *result;
  DotOperator *d_local;
  QualifiedIdentifierResolver *this_local;
  
  processorInstance.object =
       (ProcessorInstanceRef *)RewritingASTVisitor::visit((RewritingASTVisitor *)this,d);
  if ((DotOperator *)processorInstance.object != d) {
    return (Expression *)(QualifiedIdentifierResolver *)processorInstance.object;
  }
  bVar2 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                    (&this->currentConnectionEndpoint,(void *)0x0);
  if (bVar2) {
    local_38.object = (d->lhs).object;
    cast<soul::AST::ProcessorInstanceRef,soul::AST::Expression>((soul *)&local_30,&local_38);
    pool_ref<soul::AST::Expression>::~pool_ref(&local_38);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
    if (bVar2) {
      pPVar4 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator->(&local_30);
      (*(pPVar4->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[6])
                (&search.findVariables);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&search.findVariables);
      if (bVar2) {
        AST::Scope::NameSearch::NameSearch((NameSearch *)local_110);
        AST::UnqualifiedName::getIdentifierPath(&local_168,d->rhs);
        IdentifierPath::operator=((IdentifierPath *)(search.itemsFound.space + 7),&local_168);
        IdentifierPath::~IdentifierPath(&local_168);
        search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
        search.stopAtFirstScopeWithResults = false;
        search._177_1_ = 0;
        search._178_1_ = 0;
        search._179_1_ = 0;
        search.requiredNumFunctionArgs._0_1_ = 0;
        search.requiredNumFunctionArgs._1_1_ = 0;
        search.requiredNumFunctionArgs._2_1_ = 1;
        pPVar5 = pool_ptr<soul::AST::ProcessorBase>::operator->
                           ((pool_ptr<soul::AST::ProcessorBase> *)&search.findVariables);
        AST::Scope::performFullNameSearch
                  (&(pPVar5->super_ModuleBase).super_Scope,(NameSearch *)local_110,(Statement *)0x0)
        ;
        sVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                          ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                           local_110);
        if (sVar6 == 1) {
          ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                             ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                              local_110);
          local_170.object = ppVar7->object;
          bVar2 = is_type<soul::AST::EndpointDeclaration,soul::AST::ASTObject>(&local_170);
          pool_ref<soul::AST::ASTObject>::~pool_ref(&local_170);
          if (!bVar2) goto LAB_003a3f5e;
          this_00 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                    allocator;
          args = &(d->super_Expression).super_Statement.super_ASTObject.context;
          in_RCX = AST::Allocator::
                   allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                             (this_00,args,&d->rhs->identifier);
          this_local = (QualifiedIdentifierResolver *)
                       AST::Allocator::
                       allocate<soul::AST::ConnectionEndpointRef,soul::AST::Context&,soul::pool_ptr<soul::AST::ProcessorInstanceRef>&,soul::AST::UnqualifiedName&>
                                 (this_00,args,&local_30,in_RCX);
          nestedDots.object._4_4_ = 1;
        }
        else {
LAB_003a3f5e:
          nestedDots.object._4_4_ = 0;
        }
        AST::Scope::NameSearch::~NameSearch((NameSearch *)local_110);
        if (nestedDots.object._4_4_ == 0) goto LAB_003a3f90;
      }
      else {
LAB_003a3f90:
        nestedDots.object._4_4_ = 0;
      }
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr
                ((pool_ptr<soul::AST::ProcessorBase> *)&search.findVariables);
      if (nestedDots.object._4_4_ == 0) goto LAB_003a3fbf;
    }
    else {
LAB_003a3fbf:
      nestedDots.object._4_4_ = 0;
    }
    pool_ptr<soul::AST::ProcessorInstanceRef>::~pool_ptr(&local_30);
    if (nestedDots.object._4_4_ != 0) {
      return (Expression *)this_local;
    }
    local_188.object = (d->lhs).object;
    cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_180,&local_188);
    pool_ref<soul::AST::Expression>::~pool_ref(&local_188);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_180);
    if (bVar2) {
      if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
          & 1U) == 0) {
        Errors::invalidEndpointSpecifier<>();
        AST::Context::throwError
                  (&(d->super_Expression).super_Statement.super_ASTObject.context,
                   (CompileMessage *)&metaFunction,false);
      }
      in_RCX = (UnqualifiedName *)
               ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
               + 1);
      (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
           (size_t)in_RCX;
    }
    pool_ptr<soul::AST::DotOperator>::~pool_ptr(&local_180);
  }
  pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&d->lhs);
  bVar2 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    ((ErrorIgnoringRewritingASTVisitor *)this,pEVar8);
  if (bVar2) {
    return (Expression *)(QualifiedIdentifierResolver *)processorInstance.object;
  }
  pEVar8 = pool_ref<soul::AST::Expression>::get(&d->lhs);
  bVar2 = AST::isResolvedAsType(pEVar8);
  if (bVar2) {
    pUVar1 = d->rhs;
    pool_ref::operator_cast_to_Expression_((pool_ref *)&d->lhs);
    createTypeMetaFunction
              ((QualifiedIdentifierResolver *)&lhsType.structure,(UnqualifiedName *)this,
               &pUVar1->super_Expression);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&lhsType.structure);
    if (bVar2) {
      this_local = (QualifiedIdentifierResolver *)
                   pool_ptr<soul::AST::Expression>::operator*
                             ((pool_ptr<soul::AST::Expression> *)&lhsType.structure);
    }
    nestedDots.object._5_3_ = 0;
    nestedDots.object._4_1_ = bVar2;
    pool_ptr<soul::AST::Expression>::~pool_ptr
              ((pool_ptr<soul::AST::Expression> *)&lhsType.structure);
  }
  else {
    pEVar8 = pool_ref<soul::AST::Expression>::get(&d->lhs);
    bVar2 = AST::isResolvedAsValue(pEVar8);
    if (!bVar2) {
      pEVar8 = pool_ref<soul::AST::Expression>::operator->(&d->lhs);
      uVar3 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[9])();
      if ((uVar3 & 1) != 0) {
        bVar2 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                          (&this->currentConnectionEndpoint,(void *)0x0);
        local_351 = 0;
        local_4b9 = true;
        if (!bVar2) {
          AST::UnqualifiedName::toString_abi_cxx11_(&local_350,d->rhs);
          local_351 = 1;
          local_4b9 = std::operator==(&local_350,"type");
        }
        if ((local_351 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_350);
        }
        if (local_4b9 != false) {
          return (Expression *)(QualifiedIdentifierResolver *)d;
        }
        Errors::noSuchOperationOnEndpoint<>();
        AST::Context::throwError
                  (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_390,false);
      }
      pEVar8 = pool_ref<soul::AST::Expression>::get(&d->lhs);
      bVar2 = AST::isResolvedAsProcessor(pEVar8);
      if (bVar2) {
        bVar2 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                          (&this->currentConnectionEndpoint,(void *)0x0);
        if (bVar2) {
          return (Expression *)(QualifiedIdentifierResolver *)d;
        }
        Errors::noSuchOperationOnProcessor<>();
        AST::Context::throwError
                  (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_3c8,false);
      }
      goto LAB_003a48c3;
    }
    pEVar8 = pool_ref<soul::AST::Expression>::operator->(&d->lhs);
    (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[4])(&s);
    bVar2 = Type::isStruct((Type *)&s);
    if (bVar2) {
      name.field_2._8_8_ = Type::getStructRef((Type *)&s);
      AST::UnqualifiedName::toString_abi_cxx11_((string *)local_208,d->rhs);
      this_01 = name.field_2._8_8_;
      local_218 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_208);
      bVar2 = Structure::hasMemberWithName((Structure *)this_01,local_218);
      if (bVar2) {
        this_local = (QualifiedIdentifierResolver *)
                     AST::Allocator::
                     allocate<soul::AST::StructMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Structure&,std::__cxx11::string>
                               ((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator,
                                &(d->super_Expression).super_Statement.super_ASTObject.context,
                                &d->lhs,(Structure *)name.field_2._8_8_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_208);
        nestedDots.object._4_4_ = 1;
      }
      else {
        if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
             ignoreErrors & 1U) == 0) {
          pUVar1 = d->rhs;
          AST::UnqualifiedName::toString_abi_cxx11_(&local_270,pUVar1);
          Type::getDescription_abi_cxx11_((string *)((long)&name_1.field_2 + 8),(Type *)&s);
          Errors::unknownMemberInStruct<std::__cxx11::string,std::__cxx11::string>
                    (&local_250,(Errors *)&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
          AST::Context::throwError
                    (&(pUVar1->super_Expression).super_Statement.super_ASTObject.context,&local_250,
                     false);
        }
        nestedDots.object._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_208);
      if (nestedDots.object._4_4_ == 0) goto LAB_003a45e9;
    }
    else {
      bVar2 = Type::isComplex((Type *)&s);
      if (bVar2) {
        AST::UnqualifiedName::toString_abi_cxx11_((string *)local_2b0,d->rhs);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2b0,"real");
        if ((!bVar2) &&
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2b0,"imag"), !bVar2)) {
          pUVar1 = d->rhs;
          AST::UnqualifiedName::toString_abi_cxx11_(&local_308,pUVar1);
          Type::getDescription_abi_cxx11_((string *)&metaFunction_1,(Type *)&s);
          Errors::unknownMemberInComplex<std::__cxx11::string,std::__cxx11::string>
                    (&local_2e8,(Errors *)&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &metaFunction_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
          AST::Context::throwError
                    (&(pUVar1->super_Expression).super_Statement.super_ASTObject.context,&local_2e8,
                     false);
        }
        this_local = (QualifiedIdentifierResolver *)
                     AST::Allocator::
                     allocate<soul::AST::ComplexMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Type&,std::__cxx11::string>
                               ((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator,
                                &(d->super_Expression).super_Statement.super_ASTObject.context,
                                &d->lhs,(Type *)&s,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2b0);
        nestedDots.object._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_2b0);
      }
      else {
LAB_003a45e9:
        pUVar1 = d->rhs;
        pool_ref::operator_cast_to_Expression_((pool_ref *)&d->lhs);
        createTypeMetaFunction
                  ((QualifiedIdentifierResolver *)local_330,(UnqualifiedName *)this,
                   &pUVar1->super_Expression);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_330);
        if (bVar2) {
          this_local = (QualifiedIdentifierResolver *)
                       pool_ptr<soul::AST::Expression>::operator*
                                 ((pool_ptr<soul::AST::Expression> *)local_330);
        }
        nestedDots.object._5_3_ = 0;
        nestedDots.object._4_1_ = bVar2;
        pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_330);
        if (nestedDots.object._4_4_ == 0) {
          nestedDots.object._4_4_ = 0;
        }
      }
    }
    Type::~Type((Type *)&s);
  }
  if (nestedDots.object._4_4_ != 0) {
    return (Expression *)this_local;
  }
LAB_003a48c3:
  if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors & 1U
      ) != 0) {
    (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
         (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails + 1;
    return (Expression *)(QualifiedIdentifierResolver *)d;
  }
  Errors::invalidDotArguments<>();
  AST::Context::throwError
            (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_400,false);
}

Assistant:

AST::Expression& visit (AST::DotOperator& d) override
        {
            auto& result = super::visit (d);

            if (std::addressof (result) != std::addressof (d))
                return result;

            if (currentConnectionEndpoint != nullptr)
            {
                if (auto processorInstance = cast<AST::ProcessorInstanceRef> (d.lhs))
                {
                    if (auto processor = processorInstance->getAsProcessor())
                    {
                        AST::Scope::NameSearch search;
                        search.partiallyQualifiedPath = d.rhs.getIdentifierPath();
                        search.stopAtFirstScopeWithResults = true;
                        search.findVariables = false;
                        search.findTypes = false;
                        search.findFunctions = false;
                        search.findNamespaces = false;
                        search.findProcessors = false;
                        search.findProcessorInstances = false;
                        search.findEndpoints = true;

                        processor->performFullNameSearch (search, nullptr);

                        if (search.itemsFound.size() == 1)
                            if (is_type<AST::EndpointDeclaration> (search.itemsFound.front()))
                                return allocator.allocate<AST::ConnectionEndpointRef> (d.context,
                                                                                       processorInstance,
                                                                                       allocator.allocate<AST::UnqualifiedName> (d.context, d.rhs.identifier));
                    }
                }

                if (auto nestedDots = cast<AST::DotOperator> (d.lhs))
                {
                    if (ignoreErrors)
                        ++numFails;
                    else
                        d.context.throwError (Errors::invalidEndpointSpecifier());
                }
            }

            if (failIfNotResolved (d.lhs))
                return result;

            if (AST::isResolvedAsType (d.lhs.get()))
            {
                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (AST::isResolvedAsValue (d.lhs.get()))
            {
                auto lhsType = d.lhs->getResultType();

                if (lhsType.isStruct())
                {
                    auto& s = lhsType.getStructRef();
                    auto name = d.rhs.toString();

                    if (s.hasMemberWithName (name))
                        return allocator.allocate<AST::StructMemberRef> (d.context, d.lhs, s, std::move (name));

                    if (! ignoreErrors)
                        d.rhs.context.throwError (Errors::unknownMemberInStruct (d.rhs.toString(), lhsType.getDescription()));
                }
                else if (lhsType.isComplex())
                {
                    auto name = d.rhs.toString();

                    if (name == "real" || name == "imag")
                        return allocator.allocate<AST::ComplexMemberRef> (d.context, d.lhs, lhsType, std::move (name));

                    d.rhs.context.throwError (Errors::unknownMemberInComplex (d.rhs.toString(), lhsType.getDescription()));
                }

                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (d.lhs->isOutputEndpoint())
            {
                if (currentConnectionEndpoint != nullptr || d.rhs.toString() == "type")
                    return d;

                d.context.throwError (Errors::noSuchOperationOnEndpoint());
            }
            else if (AST::isResolvedAsProcessor (d.lhs.get()))
            {
                if (currentConnectionEndpoint != nullptr)
                    return d;

                d.context.throwError (Errors::noSuchOperationOnProcessor());
            }

            if (ignoreErrors)
                ++numFails;
            else
                d.context.throwError (Errors::invalidDotArguments());

            return d;
        }